

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::anon_unknown_0::DatarateTestFrameDropLarge::~DatarateTestFrameDropLarge
          (DatarateTestFrameDropLarge *this)

{
  libaom_test::EncoderTest::~EncoderTest(&(this->super_DatarateTest).super_EncoderTest);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~DatarateTestFrameDropLarge() override = default;